

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

StatusOr<absl::lts_20240722::Span<char>_> * __thiscall
google::protobuf::json_internal::anon_unknown_5::DecodeBase64InPlace
          (StatusOr<absl::lts_20240722::Span<char>_> *__return_storage_ptr__,anon_unknown_5 *this,
          Span<char> base64)

{
  ulong in_RAX;
  anon_unknown_5 *paVar1;
  anon_unknown_5 *extraout_RAX;
  anon_unknown_5 *paVar2;
  pointer pcVar3;
  long lVar4;
  uint uVar5;
  anon_unknown_5 *paVar6;
  Status local_28;
  
  pcVar3 = base64.ptr_;
  paVar6 = this + (long)pcVar3;
  paVar1 = this;
  paVar2 = this;
  if (((undefined1  [16])base64 & (undefined1  [16])0xfffffffc) != (undefined1  [16])0x0) {
    do {
      pcVar3 = pcVar3 + -4;
      uVar5 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[3]] |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[2]] << 6 |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[1]] << 0xc |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)*paVar2] << 0x12;
      if ((int)uVar5 < 0) {
        if (paVar2[3] == (anon_unknown_5)0x3d && pcVar3 == (pointer)0x0) {
          if (paVar2[2] == (anon_unknown_5)0x3d) {
            paVar6 = paVar6 + -2;
          }
          else {
            paVar6 = paVar6 + -1;
          }
        }
        break;
      }
      *paVar1 = SUB41(uVar5 >> 0x10,0);
      paVar1[1] = SUB41(uVar5 >> 8,0);
      paVar1[2] = SUB41(uVar5,0);
      paVar2 = paVar2 + 4;
      paVar1 = paVar1 + 3;
    } while (paVar2 < this + ((uint)base64.ptr_ & 0xfffffffc));
  }
  if (paVar2 < paVar6) {
    if ((long)paVar6 - (long)paVar2 == 3) {
      uVar5 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[2]] << 6 |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[1]] << 0xc |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)*paVar2] << 0x12;
      *paVar1 = SUB41(uVar5 >> 0x10,0);
      paVar1[1] = SUB41(uVar5 >> 8,0);
      lVar4 = 2;
LAB_002c1f47:
      if (-1 < (int)uVar5) {
        paVar1 = paVar1 + lVar4;
        goto LAB_002c1f4e;
      }
    }
    else if ((long)paVar6 - (long)paVar2 == 2) {
      uVar5 = (int)(char)(anonymous_namespace)::kBase64Table[(byte)paVar2[1]] << 0xc |
              (int)(char)(anonymous_namespace)::kBase64Table[(byte)*paVar2] << 0x12;
      *paVar1 = SUB41(uVar5 >> 0x10,0);
      lVar4 = 1;
      goto LAB_002c1f47;
    }
    local_28.rep_ = in_RAX;
    absl::lts_20240722::InvalidArgumentError(&local_28,0xe,"corrupt base64");
    absl::lts_20240722::internal_statusor::StatusOrData<absl::lts_20240722::Span<char>_>::
    StatusOrData<absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>,
               &local_28);
    paVar1 = extraout_RAX;
    if ((local_28.rep_ & 1) == 0) {
      paVar1 = (anon_unknown_5 *)absl::lts_20240722::status_internal::StatusRep::Unref();
    }
  }
  else {
LAB_002c1f4e:
    paVar1 = paVar1 + -(long)this;
    (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_1.data_.ptr_
         = (pointer)this;
    (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_1.data_.len_
         = (size_type)paVar1;
    (__return_storage_ptr__->super_StatusOrData<absl::lts_20240722::Span<char>_>).field_0 =
         (anon_union_8_1_1246618d_for_StatusOrData<absl::lts_20240722::Span<char>_>_1)0x1;
  }
  return (StatusOr<absl::lts_20240722::Span<char>_> *)paVar1;
}

Assistant:

absl::StatusOr<absl::Span<char>> DecodeBase64InPlace(absl::Span<char> base64) {
  // We decode in place. This is safe because this is a new buffer (not
  // aliasing the input) and because base64 decoding shrinks 4 bytes into 3.
  char* out = base64.data();
  const char* ptr = base64.data();
  const char* end = ptr + base64.size();
  const char* end4 = ptr + (base64.size() & ~3u);

  for (; ptr < end4; ptr += 4, out += 3) {
    auto val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12 |
               Base64Lookup(ptr[2]) << 6 | Base64Lookup(ptr[3]) << 0;

    if (static_cast<int32_t>(val) < 0) {
      // Junk chars or padding. Remove trailing padding, if any.
      if (end - ptr == 4 && ptr[3] == '=') {
        if (ptr[2] == '=') {
          end -= 2;
        } else {
          end -= 1;
        }
      }
      break;
    }

    out[0] = val >> 16;
    out[1] = (val >> 8) & 0xff;
    out[2] = val & 0xff;
  }

  if (ptr < end) {
    uint32_t val = ~0u;
    switch (end - ptr) {
      case 2:
        val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12;
        out[0] = val >> 16;
        out += 1;
        break;
      case 3:
        val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12 |
              Base64Lookup(ptr[2]) << 6;
        out[0] = val >> 16;
        out[1] = (val >> 8) & 0xff;
        out += 2;
        break;
    }

    if (static_cast<int32_t>(val) < 0) {
      return absl::InvalidArgumentError("corrupt base64");
    }
  }

  return absl::Span<char>(base64.data(),
                          static_cast<size_t>(out - base64.data()));
}